

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyFixNodeLinks(Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  if (node->prev == (Node *)0x0) {
    ppNVar2 = &node->parent->content;
  }
  else {
    ppNVar2 = &node->prev->next;
  }
  *ppNVar2 = node;
  if (node->next == (Node *)0x0) {
    ppNVar2 = &node->parent->last;
  }
  else {
    ppNVar2 = &node->next->prev;
  }
  *ppNVar2 = node;
  ppNVar2 = &node->content;
  while (pNVar1 = *ppNVar2, pNVar1 != (Node *)0x0) {
    pNVar1->parent = node;
    ppNVar2 = &pNVar1->next;
  }
  return;
}

Assistant:

void TY_(FixNodeLinks)(Node *node)
{
    Node *child;

    if (node->prev)
        node->prev->next = node;
    else
        node->parent->content = node;

    if (node->next)
        node->next->prev = node;
    else
        node->parent->last = node;

    for (child = node->content; child; child = child->next)
        child->parent = node;
}